

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int yy_pop_parser_stack(yyParser *pParser)

{
  yyParser *in_RDI;
  yyStackEntry *yytos;
  uchar yymajor;
  byte yymajor_00;
  uint local_4;
  
  if (in_RDI->yyidx < 0) {
    local_4 = 0;
  }
  else {
    yymajor_00 = *(byte *)((long)&(((YYMINORTYPE *)(in_RDI->yystack + in_RDI->yyidx))->yy0).z + 2);
    yy_destructor(in_RDI,yymajor_00,(YYMINORTYPE *)(in_RDI->yystack + in_RDI->yyidx));
    in_RDI->yyidx = in_RDI->yyidx + -1;
    local_4 = (uint)yymajor_00;
  }
  return local_4;
}

Assistant:

static int yy_pop_parser_stack(yyParser *pParser){
  YYCODETYPE yymajor;
  yyStackEntry *yytos = &pParser->yystack[pParser->yyidx];

  /* There is no mechanism by which the parser stack can be popped below
  ** empty in SQLite.  */
  if( NEVER(pParser->yyidx<0) ) return 0;
#ifndef NDEBUG
  if( yyTraceFILE && pParser->yyidx>=0 ){
    fprintf(yyTraceFILE,"%sPopping %s\n",
      yyTracePrompt,
      yyTokenName[yytos->major]);
  }
#endif
  yymajor = yytos->major;
  yy_destructor(pParser, yymajor, &yytos->minor);
  pParser->yyidx--;
  return yymajor;
}